

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

int __thiscall
cmsys::SystemInformationImplementation::GetProcessorCacheXSize
          (SystemInformationImplementation *this,long dwCacheID)

{
  if (dwCacheID == 0x20000) {
    return (this->Features).L3CacheSize;
  }
  if (dwCacheID != 0x10000) {
    if (dwCacheID == 0x8000) {
      return (this->Features).L1CacheSize;
    }
    return -1;
  }
  return (this->Features).L2CacheSize;
}

Assistant:

int SystemInformationImplementation::GetProcessorCacheXSize(long int dwCacheID)
{
  switch (dwCacheID) {
    case SystemInformation::CPU_FEATURE_L1CACHE:
      return this->Features.L1CacheSize;
    case SystemInformation::CPU_FEATURE_L2CACHE:
      return this->Features.L2CacheSize;
    case SystemInformation::CPU_FEATURE_L3CACHE:
      return this->Features.L3CacheSize;
  }
  return -1;
}